

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int player_id_to_position(int _player_id)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = _player_id - my_player_id;
  uVar1 = iVar2 + 7;
  if (-1 < (int)(iVar2 + 4U)) {
    uVar1 = iVar2 + 4U;
  }
  return *(int *)(&DAT_001270a0 + (long)(int)((iVar2 - (uVar1 & 0xfffffffc)) + 4) * 4);
}

Assistant:

int player_id_to_position(int _player_id) {
    switch ((_player_id + 4 - my_player_id) % 4) {
        case 0: //自己
            return 0;
        case 1: //下家
            return 3;
        case 2: //对家
            return 2;
        case 3: //上家
            return 1;
    }
}